

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

char * lys_status2str(uint16_t flags)

{
  char *pcStack_10;
  uint16_t flags_local;
  
  switch(flags & 0x1c) {
  case 0:
  case 4:
    pcStack_10 = "current";
    break;
  case 8:
    pcStack_10 = "deprecated";
    break;
  default:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
           ,0x1a0);
    pcStack_10 = (char *)0x0;
    break;
  case 0x10:
    pcStack_10 = "obsolete";
  }
  return pcStack_10;
}

Assistant:

static const char *
lys_status2str(uint16_t flags)
{
    flags &= LYS_STATUS_MASK;

    switch (flags) {
    case 0:
    case LYS_STATUS_CURR:
        return "current";
    case LYS_STATUS_DEPRC:
        return "deprecated";
    case LYS_STATUS_OBSLT:
        return "obsolete";
    default:
        LOGINT(NULL);
        return NULL;
    }
}